

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# milo.c
# Opt level: O0

void * milo_context_push(milo_context *c,size_t size)

{
  size_t sVar1;
  char *pcVar2;
  void *ret;
  size_t size_local;
  milo_context *c_local;
  
  if (size == 0) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KevinOfNeu[P]Milo/milo.c",
                  0x1f,"void *milo_context_push(milo_context *, size_t)");
  }
  if (c->size <= c->top + size) {
    if (c->size == 0) {
      c->size = 0x100;
    }
    while (c->size <= c->top + size) {
      c->size = (c->size >> 1) + c->size;
    }
    pcVar2 = (char *)realloc(c->stack,c->size);
    c->stack = pcVar2;
  }
  sVar1 = c->top;
  c->top = size + c->top;
  return c->stack + sVar1;
}

Assistant:

static void* milo_context_push(milo_context* c, size_t size) {
    void* ret;
    assert(size > 0);
    if (c->top + size >= c->size) {
        if (c->size == 0)
            c->size = MILO_PARSE_STACK_INIT_SIZE;
        while (c->top + size >= c->size)
            c->size += c->size >> 1; /* c->size * 1.5 */
        c->stack = (char*) realloc(c->stack, c->size);
    }
    ret = c->stack + c->top;
    c->top += size;
    return ret;
}